

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O2

void ConvertBGRAToRGBA_SSE2(uint32_t *src,int num_pixels,uint8_t *dst)

{
  undefined4 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 *puVar54;
  __m128i *out;
  __m128i *in;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  
  for (; 7 < num_pixels; num_pixels = num_pixels + -8) {
    auVar55 = *(undefined1 (*) [16])src;
    auVar56 = *(undefined1 (*) [16])((long)src + 0x10);
    src = (uint32_t *)((long)src + 0x20);
    auVar57[1] = 0;
    auVar57[0] = auVar55[8];
    auVar57[2] = auVar55[9];
    auVar57[3] = 0;
    auVar57[4] = auVar55[10];
    auVar57[5] = 0;
    auVar57[6] = auVar55[0xb];
    auVar57[7] = 0;
    auVar57[8] = auVar55[0xc];
    auVar57[9] = 0;
    auVar57[10] = auVar55[0xd];
    auVar57[0xb] = 0;
    auVar57[0xc] = auVar55[0xe];
    auVar57[0xd] = 0;
    auVar57[0xe] = auVar55[0xf];
    auVar57[0xf] = 0;
    auVar57 = pshuflw(auVar57,auVar57,0xc6);
    auVar57 = pshufhw(auVar57,auVar57,0xc6);
    auVar34[0xd] = 0;
    auVar34._0_13_ = auVar55._0_13_;
    auVar34[0xe] = auVar55[7];
    auVar36[0xc] = auVar55[6];
    auVar36._0_12_ = auVar55._0_12_;
    auVar36._13_2_ = auVar34._13_2_;
    auVar38[0xb] = 0;
    auVar38._0_11_ = auVar55._0_11_;
    auVar38._12_3_ = auVar36._12_3_;
    auVar40[10] = auVar55[5];
    auVar40._0_10_ = auVar55._0_10_;
    auVar40._11_4_ = auVar38._11_4_;
    auVar42[9] = 0;
    auVar42._0_9_ = auVar55._0_9_;
    auVar42._10_5_ = auVar40._10_5_;
    auVar44[8] = auVar55[4];
    auVar44._0_8_ = auVar55._0_8_;
    auVar44._9_6_ = auVar42._9_6_;
    auVar48._7_8_ = 0;
    auVar48._0_7_ = auVar44._8_7_;
    auVar50._1_8_ = SUB158(auVar48 << 0x40,7);
    auVar50[0] = auVar55[3];
    auVar50._9_6_ = 0;
    auVar51._1_10_ = SUB1510(auVar50 << 0x30,5);
    auVar51[0] = auVar55[2];
    auVar51._11_4_ = 0;
    auVar46[2] = auVar55[1];
    auVar46._0_2_ = auVar55._0_2_;
    auVar46._3_12_ = SUB1512(auVar51 << 0x20,3);
    auVar55._0_2_ = auVar55._0_2_ & 0xff;
    auVar55._2_13_ = auVar46._2_13_;
    auVar55[0xf] = 0;
    auVar55 = pshuflw(auVar55,auVar55,0xc6);
    auVar55 = pshufhw(auVar55,auVar55,0xc6);
    sVar2 = auVar55._0_2_;
    sVar4 = auVar55._2_2_;
    sVar6 = auVar55._4_2_;
    sVar8 = auVar55._6_2_;
    sVar10 = auVar55._8_2_;
    sVar12 = auVar55._10_2_;
    sVar14 = auVar55._12_2_;
    sVar16 = auVar55._14_2_;
    sVar18 = auVar57._0_2_;
    sVar20 = auVar57._2_2_;
    sVar22 = auVar57._4_2_;
    sVar24 = auVar57._6_2_;
    sVar26 = auVar57._8_2_;
    sVar28 = auVar57._10_2_;
    sVar30 = auVar57._12_2_;
    sVar32 = auVar57._14_2_;
    auVar58[1] = 0;
    auVar58[0] = auVar56[8];
    auVar58[2] = auVar56[9];
    auVar58[3] = 0;
    auVar58[4] = auVar56[10];
    auVar58[5] = 0;
    auVar58[6] = auVar56[0xb];
    auVar58[7] = 0;
    auVar58[8] = auVar56[0xc];
    auVar58[9] = 0;
    auVar58[10] = auVar56[0xd];
    auVar58[0xb] = 0;
    auVar58[0xc] = auVar56[0xe];
    auVar58[0xd] = 0;
    auVar58[0xe] = auVar56[0xf];
    auVar58[0xf] = 0;
    auVar58 = pshuflw(auVar58,auVar58,0xc6);
    auVar58 = pshufhw(auVar58,auVar58,0xc6);
    auVar35[0xd] = 0;
    auVar35._0_13_ = auVar56._0_13_;
    auVar35[0xe] = auVar56[7];
    auVar37[0xc] = auVar56[6];
    auVar37._0_12_ = auVar56._0_12_;
    auVar37._13_2_ = auVar35._13_2_;
    auVar39[0xb] = 0;
    auVar39._0_11_ = auVar56._0_11_;
    auVar39._12_3_ = auVar37._12_3_;
    auVar41[10] = auVar56[5];
    auVar41._0_10_ = auVar56._0_10_;
    auVar41._11_4_ = auVar39._11_4_;
    auVar43[9] = 0;
    auVar43._0_9_ = auVar56._0_9_;
    auVar43._10_5_ = auVar41._10_5_;
    auVar45[8] = auVar56[4];
    auVar45._0_8_ = auVar56._0_8_;
    auVar45._9_6_ = auVar43._9_6_;
    auVar49._7_8_ = 0;
    auVar49._0_7_ = auVar45._8_7_;
    auVar52._1_8_ = SUB158(auVar49 << 0x40,7);
    auVar52[0] = auVar56[3];
    auVar52._9_6_ = 0;
    auVar53._1_10_ = SUB1510(auVar52 << 0x30,5);
    auVar53[0] = auVar56[2];
    auVar53._11_4_ = 0;
    auVar47[2] = auVar56[1];
    auVar47._0_2_ = auVar56._0_2_;
    auVar47._3_12_ = SUB1512(auVar53 << 0x20,3);
    auVar56._0_2_ = auVar56._0_2_ & 0xff;
    auVar56._2_13_ = auVar47._2_13_;
    auVar56[0xf] = 0;
    auVar56 = pshuflw(auVar56,auVar56,0xc6);
    auVar56 = pshufhw(auVar56,auVar56,0xc6);
    sVar3 = auVar56._0_2_;
    sVar5 = auVar56._2_2_;
    sVar7 = auVar56._4_2_;
    sVar9 = auVar56._6_2_;
    sVar11 = auVar56._8_2_;
    sVar13 = auVar56._10_2_;
    sVar15 = auVar56._12_2_;
    sVar17 = auVar56._14_2_;
    sVar19 = auVar58._0_2_;
    sVar21 = auVar58._2_2_;
    sVar23 = auVar58._4_2_;
    sVar25 = auVar58._6_2_;
    sVar27 = auVar58._8_2_;
    sVar29 = auVar58._10_2_;
    sVar31 = auVar58._12_2_;
    sVar33 = auVar58._14_2_;
    *dst = (0 < sVar2) * (sVar2 < 0x100) * auVar55[0] - (0xff < sVar2);
    dst[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar55[2] - (0xff < sVar4);
    dst[2] = (0 < sVar6) * (sVar6 < 0x100) * auVar55[4] - (0xff < sVar6);
    dst[3] = (0 < sVar8) * (sVar8 < 0x100) * auVar55[6] - (0xff < sVar8);
    dst[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar55[8] - (0xff < sVar10);
    dst[5] = (0 < sVar12) * (sVar12 < 0x100) * auVar55[10] - (0xff < sVar12);
    dst[6] = (0 < sVar14) * (sVar14 < 0x100) * auVar55[0xc] - (0xff < sVar14);
    dst[7] = (0 < sVar16) * (sVar16 < 0x100) * auVar55[0xe] - (0xff < sVar16);
    dst[8] = (0 < sVar18) * (sVar18 < 0x100) * auVar57[0] - (0xff < sVar18);
    dst[9] = (0 < sVar20) * (sVar20 < 0x100) * auVar57[2] - (0xff < sVar20);
    dst[10] = (0 < sVar22) * (sVar22 < 0x100) * auVar57[4] - (0xff < sVar22);
    dst[0xb] = (0 < sVar24) * (sVar24 < 0x100) * auVar57[6] - (0xff < sVar24);
    dst[0xc] = (0 < sVar26) * (sVar26 < 0x100) * auVar57[8] - (0xff < sVar26);
    dst[0xd] = (0 < sVar28) * (sVar28 < 0x100) * auVar57[10] - (0xff < sVar28);
    dst[0xe] = (0 < sVar30) * (sVar30 < 0x100) * auVar57[0xc] - (0xff < sVar30);
    dst[0xf] = (0 < sVar32) * (sVar32 < 0x100) * auVar57[0xe] - (0xff < sVar32);
    dst[0x10] = (0 < sVar3) * (sVar3 < 0x100) * auVar56[0] - (0xff < sVar3);
    dst[0x11] = (0 < sVar5) * (sVar5 < 0x100) * auVar56[2] - (0xff < sVar5);
    dst[0x12] = (0 < sVar7) * (sVar7 < 0x100) * auVar56[4] - (0xff < sVar7);
    dst[0x13] = (0 < sVar9) * (sVar9 < 0x100) * auVar56[6] - (0xff < sVar9);
    dst[0x14] = (0 < sVar11) * (sVar11 < 0x100) * auVar56[8] - (0xff < sVar11);
    dst[0x15] = (0 < sVar13) * (sVar13 < 0x100) * auVar56[10] - (0xff < sVar13);
    dst[0x16] = (0 < sVar15) * (sVar15 < 0x100) * auVar56[0xc] - (0xff < sVar15);
    dst[0x17] = (0 < sVar17) * (sVar17 < 0x100) * auVar56[0xe] - (0xff < sVar17);
    dst[0x18] = (0 < sVar19) * (sVar19 < 0x100) * auVar58[0] - (0xff < sVar19);
    dst[0x19] = (0 < sVar21) * (sVar21 < 0x100) * auVar58[2] - (0xff < sVar21);
    dst[0x1a] = (0 < sVar23) * (sVar23 < 0x100) * auVar58[4] - (0xff < sVar23);
    dst[0x1b] = (0 < sVar25) * (sVar25 < 0x100) * auVar58[6] - (0xff < sVar25);
    dst[0x1c] = (0 < sVar27) * (sVar27 < 0x100) * auVar58[8] - (0xff < sVar27);
    dst[0x1d] = (0 < sVar29) * (sVar29 < 0x100) * auVar58[10] - (0xff < sVar29);
    dst[0x1e] = (0 < sVar31) * (sVar31 < 0x100) * auVar58[0xc] - (0xff < sVar31);
    dst[0x1f] = (0 < sVar33) * (sVar33 < 0x100) * auVar58[0xe] - (0xff < sVar33);
    dst = dst + 0x20;
  }
  if (num_pixels < 1) {
    return;
  }
  puVar54 = *(undefined1 (*) [16])src;
  for (; src < (undefined1 (*) [16])(puVar54 + (long)num_pixels * 4);
      src = (uint32_t *)(*(undefined1 (*) [16])src + 4)) {
    uVar1 = *(undefined4 *)*(undefined1 (*) [16])src;
    *dst = (uint8_t)((uint)uVar1 >> 0x10);
    dst[1] = (uint8_t)((uint)uVar1 >> 8);
    dst[2] = (uint8_t)uVar1;
    dst[3] = (uint8_t)((uint)uVar1 >> 0x18);
    dst = dst + 4;
  }
  return;
}

Assistant:

static void ConvertBGRAToRGBA_SSE2(const uint32_t* src,
                                   int num_pixels, uint8_t* dst) {
  const __m128i red_blue_mask = _mm_set1_epi32(0x00ff00ffu);
  const __m128i* in = (const __m128i*)src;
  __m128i* out = (__m128i*)dst;
  while (num_pixels >= 8) {
    const __m128i A1 = _mm_loadu_si128(in++);
    const __m128i A2 = _mm_loadu_si128(in++);
    const __m128i B1 = _mm_and_si128(A1, red_blue_mask);     // R 0 B 0
    const __m128i B2 = _mm_and_si128(A2, red_blue_mask);     // R 0 B 0
    const __m128i C1 = _mm_andnot_si128(red_blue_mask, A1);  // 0 G 0 A
    const __m128i C2 = _mm_andnot_si128(red_blue_mask, A2);  // 0 G 0 A
    const __m128i D1 = _mm_shufflelo_epi16(B1, _MM_SHUFFLE(2, 3, 0, 1));
    const __m128i D2 = _mm_shufflelo_epi16(B2, _MM_SHUFFLE(2, 3, 0, 1));
    const __m128i E1 = _mm_shufflehi_epi16(D1, _MM_SHUFFLE(2, 3, 0, 1));
    const __m128i E2 = _mm_shufflehi_epi16(D2, _MM_SHUFFLE(2, 3, 0, 1));
    const __m128i F1 = _mm_or_si128(E1, C1);
    const __m128i F2 = _mm_or_si128(E2, C2);
    _mm_storeu_si128(out++, F1);
    _mm_storeu_si128(out++, F2);
    num_pixels -= 8;
  }
  // left-overs
  if (num_pixels > 0) {
    VP8LConvertBGRAToRGBA_C((const uint32_t*)in, num_pixels, (uint8_t*)out);
  }
}